

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t canXz(void)

{
  wchar_t wVar1;
  
  if (canXz_tested == '\0') {
    canXz_tested = '\x01';
    wVar1 = systemf("xz -V %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canXz_value = 1;
    }
  }
  return (uint)canXz_value;
}

Assistant:

int
canXz(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("xz -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}